

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::stencilOpSeparate
          (ReferenceContext *this,deUint32 face,deUint32 sfail,deUint32 dpfail,deUint32 dppass)

{
  bool bVar1;
  ulong uVar2;
  deUint32 *pdVar3;
  
  bVar1 = isValidStencilOp(sfail);
  if ((((bVar1) && (bVar1 = isValidStencilOp(dpfail), bVar1)) &&
      (bVar1 = isValidStencilOp(dppass), bVar1)) &&
     ((face - 0x404 < 5 && ((0x13U >> (face - 0x404 & 0x1f) & 1) != 0)))) {
    pdVar3 = &this->m_stencil[0].opDepthPass;
    uVar2 = 0;
    do {
      if ((uVar2 & 1) == 0) {
        if ((face == 0x404) || (face == 0x408)) goto LAB_009a723f;
        if (uVar2 == 1) goto LAB_009a7219;
      }
      else {
LAB_009a7219:
        if ((face == 0x408) || (face == 0x405)) {
LAB_009a723f:
          pdVar3[-2] = sfail;
          pdVar3[-1] = dpfail;
          *pdVar3 = dppass;
        }
      }
      uVar2 = uVar2 + 1;
      pdVar3 = pdVar3 + 7;
    } while (uVar2 == 1);
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::stencilOpSeparate (deUint32 face, deUint32 sfail, deUint32 dpfail, deUint32 dppass)
{
	const bool	setFront	= face == GL_FRONT || face == GL_FRONT_AND_BACK;
	const bool	setBack		= face == GL_BACK || face == GL_FRONT_AND_BACK;

	RC_IF_ERROR(!isValidStencilOp(sfail)	||
				!isValidStencilOp(dpfail)	||
				!isValidStencilOp(dppass),
				GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(!setFront && !setBack, GL_INVALID_ENUM, RC_RET_VOID);

	for (int type = 0; type < rr::FACETYPE_LAST; ++type)
	{
		if ((type == rr::FACETYPE_FRONT && setFront) ||
			(type == rr::FACETYPE_BACK && setBack))
		{
			m_stencil[type].opStencilFail	= sfail;
			m_stencil[type].opDepthFail		= dpfail;
			m_stencil[type].opDepthPass		= dppass;
		}
	}
}